

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.h
# Opt level: O2

void __thiscall Bus::~Bus(Bus *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->cart).super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  m2C02::~m2C02(&this->ppu);
  m6502::~m6502(&this->cpu);
  return;
}

Assistant:

~Bus() {}